

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_pairs.cpp
# Opt level: O2

string * trim(string *__return_storage_ptr__,string *s)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  size_type sVar4;
  stringstream ss;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  pcVar2 = (s->_M_dataplus)._M_p;
  sVar3 = s->_M_string_length;
  for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
    cVar1 = pcVar2[sVar4];
    if (cVar1 != ' ') {
      std::operator<<(local_1a0,cVar1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string trim(const std::string& s)
{
	std::stringstream ss;
	for (const auto& c : s)
		if (c != ' ')
			ss << c;
	return ss.str();
}